

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeValue(BuiltStyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  Value *root;
  BuiltStyledStreamWriter *in_RSI;
  long in_RDI;
  Value *childValue;
  string *name;
  iterator it;
  Members members;
  bool ok;
  char *end;
  char *str;
  string *in_stack_fffffffffffffdb8;
  BuiltStyledStreamWriter *in_stack_fffffffffffffdc0;
  BuiltStyledStreamWriter *this_00;
  char **in_stack_fffffffffffffdc8;
  BuiltStyledStreamWriter *in_stack_fffffffffffffdd0;
  Value *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde8;
  undefined1 value_00;
  allocator<char> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  LargestUInt in_stack_fffffffffffffe18;
  BuiltStyledStreamWriter *in_stack_fffffffffffffe30;
  string local_1c8 [16];
  Value *in_stack_fffffffffffffe48;
  BuiltStyledStreamWriter *in_stack_fffffffffffffe50;
  string local_1a0 [32];
  Value *local_180;
  Value *in_stack_fffffffffffffe88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe90;
  allocator<char> local_161;
  string local_160 [36];
  undefined4 in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91;
  Value *in_stack_ffffffffffffff78;
  string local_80 [8];
  Value *in_stack_ffffffffffffff88;
  string local_60 [48];
  string local_30 [24];
  Value *in_stack_ffffffffffffffe8;
  
  value_00 = (undefined1)((ulong)in_stack_fffffffffffffde8 >> 0x38);
  VVar2 = Value::type((Value *)in_RSI);
  root = (Value *)(ulong)VVar2;
  switch(root) {
  case (Value *)0x0:
    pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    break;
  case (Value *)0x1:
    Value::asLargestInt((Value *)0x200a8c);
    valueToString_abi_cxx11_((LargestInt)local_30);
    pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_30);
    break;
  case (Value *)0x2:
    Value::asLargestUInt((Value *)0x200af7);
    valueToString_abi_cxx11_(in_stack_fffffffffffffe18);
    pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_60);
    break;
  case (Value *)0x3:
    Value::asDouble(in_stack_ffffffffffffff88);
    (anonymous_namespace)::valueToString_abi_cxx11_
              ((double)root,SUB81((ulong)in_RDI >> 0x38,0),(uint)in_RDI);
    pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_80);
    break;
  case (Value *)0x4:
    local_91 = Value::getString(in_stack_fffffffffffffdd8,(char **)in_stack_fffffffffffffdd0,
                                in_stack_fffffffffffffdc8);
    if ((bool)local_91) {
      valueToQuotedStringN_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      __s = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,(char *)__s,in_stack_fffffffffffffdf0);
      pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    break;
  case (Value *)0x5:
    Value::asBool(in_stack_ffffffffffffff78);
    valueToString_abi_cxx11_((bool)value_00);
    pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_100);
    break;
  case (Value *)0x6:
    writeArrayValue((BuiltStyledStreamWriter *)in_stack_fffffffffffffe90._M_current,
                    in_stack_fffffffffffffe88);
    break;
  case (Value *)0x7:
    Value::getMemberNames_abi_cxx11_(in_stack_ffffffffffffffe8);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffdd0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      pushValue(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      writeWithIndent(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
      indent((BuiltStyledStreamWriter *)0x200ed9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdb8);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&stack0xfffffffffffffe90);
        in_stack_fffffffffffffdd8 =
             Value::operator[](in_stack_fffffffffffffdd8,(string *)in_stack_fffffffffffffdd0);
        local_180 = in_stack_fffffffffffffdd8;
        writeCommentBeforeValue(in_stack_fffffffffffffe30,root);
        in_stack_fffffffffffffdd0 = (BuiltStyledStreamWriter *)std::__cxx11::string::data();
        std::__cxx11::string::length();
        valueToQuotedStringN_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
        writeWithIndent(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        std::__cxx11::string::~string(local_1a0);
        std::operator<<(*(ostream **)(in_RDI + 8),(string *)(in_RDI + 0x78));
        writeValue(in_RSI,in_stack_ffffffffffffffe8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&stack0xfffffffffffffe90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdb8);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffdc0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffdb8);
        if (bVar1) break;
        std::operator<<(*(ostream **)(in_RDI + 8),",");
        writeCommentAfterValueOnSameLine(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      writeCommentAfterValueOnSameLine(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      unindent(in_stack_fffffffffffffdd0);
      this_00 = (BuiltStyledStreamWriter *)&stack0xfffffffffffffe37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      writeWithIndent(this_00,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdd0);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeValue(Value const& value) {
  switch (value.type()) {
  case nullValue:
    pushValue(nullSymbol_);
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble(), useSpecialFloats_, precision_));
    break;
  case stringValue:
  {
    // Is NULL is possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        JSONCPP_STRING const& name = *it;
        Value const& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedStringN(name.data(), static_cast<unsigned>(name.length())));
        *sout_ << colonSymbol_;
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}